

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O1

void __thiscall TPZStream::Read(TPZStream *this,string *p,int howMany)

{
  char *pcVar1;
  uint uVar2;
  undefined8 in_RAX;
  char *__s;
  ulong uVar3;
  int stringSize;
  undefined8 uStack_38;
  
  if (0 < howMany) {
    uVar3 = (ulong)(uint)howMany;
    uStack_38 = in_RAX;
    do {
      p->_M_string_length = 0;
      *(p->_M_dataplus)._M_p = '\0';
      uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
      (*this->_vptr_TPZStream[0x1d])(this,(long)&uStack_38 + 4,1);
      uVar2 = uStack_38._4_4_;
      __s = (char *)operator_new__((long)(int)uStack_38._4_4_ + 1);
      (*this->_vptr_TPZStream[0x25])(this,__s,(ulong)uVar2);
      __s[(int)uStack_38._4_4_] = '\0';
      pcVar1 = (char *)p->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)p,0,pcVar1,(ulong)__s);
      operator_delete(__s,1);
      p = p + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void TPZStream::Read(std::string *p, int howMany) {
    char *temp;
    for (int c = 0; c < howMany; c++) {
        p[c].clear();
        int stringSize = -1;
        Read(&stringSize, 1);
        temp = new char[stringSize+1];
        Read(temp, stringSize);
        temp[stringSize] = 0;
        p[c] = temp;
        delete temp;
    }
}